

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O3

void __thiscall wasm::Instrumenter::run(Instrumenter *this,Module *wasm)

{
  iterator __begin2;
  pointer puVar1;
  iterator __end2;
  size_t numFuncs;
  
  this->wasm = wasm;
  numFuncs = 0;
  for (puVar1 = (wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 != (wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    numFuncs = numFuncs +
               (*(char **)((long)&(((puVar1->_M_t).
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                                  super_Importable).module + 8) == (char *)0x0);
  }
  addGlobals(this,numFuncs);
  addSecondaryMemory(this,numFuncs);
  instrumentFuncs(this);
  addProfileExport(this,numFuncs);
  return;
}

Assistant:

void Instrumenter::run(Module* wasm) {
  this->wasm = wasm;

  size_t numFuncs = 0;
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function*) { ++numFuncs; });

  addGlobals(numFuncs);
  addSecondaryMemory(numFuncs);
  instrumentFuncs();
  addProfileExport(numFuncs);
}